

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  CumulativeReporterBase<Catch::JunitReporter>::CumulativeReporterBase
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,_config);
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__JunitReporter_001aef08;
  XmlWriter::XmlWriter(&this->xml,_config->m_stream);
  (this->suiteTimer).m_nanoseconds = 0;
  (this->stdOutForSuite)._M_dataplus._M_p = (pointer)&(this->stdOutForSuite).field_2;
  (this->stdOutForSuite)._M_string_length = 0;
  (this->stdOutForSuite).field_2._M_local_buf[0] = '\0';
  (this->stdErrForSuite)._M_dataplus._M_p = (pointer)&(this->stdErrForSuite).field_2;
  (this->stdErrForSuite)._M_string_length = 0;
  (this->stdErrForSuite).field_2._M_local_buf[0] = '\0';
  this->unexpectedExceptions = 0;
  this->m_okToFail = false;
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).m_reporterPrefs.shouldRedirectStdOut =
       true;
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).m_reporterPrefs.
  shouldReportAllAssertions = true;
  return;
}

Assistant:

JunitReporter::JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
            m_reporterPrefs.shouldReportAllAssertions = true;
        }